

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

void * memcpy(void *__dest,void *__src,size_t __n)

{
  undefined8 local_38;
  size_t i;
  uchar *s2_;
  uchar *s1_;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  for (local_38 = 0; local_38 < __n; local_38 = local_38 + 1) {
    *(undefined1 *)((long)__dest + local_38) = *(undefined1 *)((long)__src + local_38);
  }
  return __dest;
}

Assistant:

void *memcpy(void *s1, const void *s2, size_t n) {
    unsigned char *s1_ = s1;
    const unsigned char *s2_ = s2;
    for (size_t i = 0; i < n; ++i) {
        s1_[i] = s2_[i];
    }

    return s1;
}